

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::IssueMessage(cmake *this,MessageType t,string *text,cmListFileBacktrace *bt,bool force)

{
  bool bVar1;
  MessageType t_00;
  cmake *this_00;
  undefined3 in_register_00000081;
  cmListFileBacktrace backtrace;
  ostringstream msg;
  cmListFileBacktrace cStack_1d8;
  
  cmListFileBacktrace::cmListFileBacktrace(&cStack_1d8,bt);
  t_00 = t;
  if (((CONCAT31(in_register_00000081,force) != 0) || (t_00 = ConvertMessageType(this,t), t_00 != t)
      ) || (bVar1 = IsMessageTypeVisible(this,t), t_00 = t, bVar1)) {
    this_00 = (cmake *)&stack0xfffffffffffffe68;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    PrintMessagePreamble(this_00,t_00,(ostream *)&stack0xfffffffffffffe68);
    cmListFileBacktrace::PrintTitle(&cStack_1d8,(ostream *)&stack0xfffffffffffffe68);
    printMessageText((ostream *)&stack0xfffffffffffffe68,text);
    cmListFileBacktrace::PrintCallStack(&cStack_1d8,(ostream *)&stack0xfffffffffffffe68);
    displayMessage(t_00,(ostringstream *)&stack0xfffffffffffffe68);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe68);
  }
  cmListFileBacktrace::~cmListFileBacktrace(&cStack_1d8);
  return;
}

Assistant:

void cmake::IssueMessage(cmake::MessageType t, std::string const& text,
                         cmListFileBacktrace const& bt,
                         bool force)
{
  cmListFileBacktrace backtrace = bt;

  if (!force)
    {
    // override the message type, if needed, for warnings and errors
    cmake::MessageType override = this->ConvertMessageType(t);
    if (override != t)
      {
      t = override;
      force = true;
      }
    }

  if (!force && !this->IsMessageTypeVisible(t))
    {
    return;
    }

  std::ostringstream msg;
  if (!this->PrintMessagePreamble(t, msg))
    {
    return;
    }

  // Add the immediate context.
  backtrace.PrintTitle(msg);

  printMessageText(msg, text);

  // Add the rest of the context.
  backtrace.PrintCallStack(msg);

  displayMessage(t, msg);
}